

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O0

void psh_glyph_interpolate_normal_points(PSH_Glyph glyph,FT_Int dimension)

{
  FT_Fixed FVar1;
  FT_Memory memory_00;
  long lVar2;
  PSH_Point pPVar3;
  PSH_Point pPVar4;
  long lVar5;
  FT_Int32 FVar6;
  FT_Long FVar7;
  FT_Pos u;
  FT_UInt nn;
  PSH_Point_conflict after;
  PSH_Point_conflict before;
  PSH_Point_conflict *insert;
  PSH_Point_conflict pPStack_d8;
  FT_Error error;
  PSH_Point_conflict point;
  PSH_Point_conflict points_end;
  PSH_Point_conflict points;
  undefined1 auStack_b8 [4];
  FT_UInt num_strongs;
  PSH_Point_conflict strongs_0 [16];
  PSH_Point_conflict *strongs;
  FT_Memory memory;
  FT_Fixed scale;
  PSH_Dimension dim;
  FT_Int dimension_local;
  PSH_Glyph glyph_local;
  
  FVar1 = glyph->globals->dimension[dimension].scale_mult;
  memory_00 = glyph->memory;
  strongs_0[0xf] = (PSH_Point_conflict)0x0;
  points._4_4_ = 0;
  points_end = glyph->points;
  point = points_end + glyph->num_points;
  for (pPStack_d8 = points_end; pPStack_d8 < point; pPStack_d8 = pPStack_d8 + 1) {
    if ((pPStack_d8->flags2 & 0x10) != 0) {
      points._4_4_ = points._4_4_ + 1;
    }
  }
  if (points._4_4_ != 0) {
    if (points._4_4_ < 0x11) {
      strongs_0[0xf] = (PSH_Point_conflict)auStack_b8;
    }
    else {
      strongs_0[0xf] =
           (PSH_Point_conflict)
           ft_mem_realloc(memory_00,8,0,(ulong)points._4_4_,(void *)0x0,
                          (FT_Error *)((long)&insert + 4));
      if (insert._4_4_ != 0) {
        return;
      }
    }
    points._4_4_ = 0;
    for (pPStack_d8 = points_end; pPStack_d8 < point; pPStack_d8 = pPStack_d8 + 1) {
      if ((pPStack_d8->flags2 & 0x10) != 0) {
        before = (PSH_Point_conflict)(&strongs_0[0xf]->prev + points._4_4_);
        while ((strongs_0[0xf] < before && (pPStack_d8->org_u < *(long *)(before[-1].cur_u + 0x30)))
              ) {
          before->prev = (PSH_Point)before[-1].cur_u;
          before = (PSH_Point_conflict)&before[-1].cur_u;
        }
        before->prev = pPStack_d8;
        points._4_4_ = points._4_4_ + 1;
      }
    }
    for (pPStack_d8 = points_end; pPStack_d8 < point; pPStack_d8 = pPStack_d8 + 1) {
      if ((pPStack_d8->flags2 & 0x10) == 0) {
        if ((pPStack_d8->flags & 2) != 0) {
          if (((pPStack_d8->dir_in == '\x04') || (pPStack_d8->dir_in != pPStack_d8->dir_out)) ||
             (((pPStack_d8->flags2 & 0x40) == 0 && ((pPStack_d8->flags & 4) == 0))))
          goto LAB_00313459;
          pPStack_d8->flags = pPStack_d8->flags & 0xfffffffd;
        }
        u._4_4_ = 0;
        while ((u._4_4_ < points._4_4_ &&
               ((&strongs_0[0xf]->prev)[u._4_4_]->org_u <= pPStack_d8->org_u))) {
          u._4_4_ = u._4_4_ + 1;
        }
        FVar6 = (FT_Int32)FVar1;
        if (u._4_4_ == 0) {
          lVar2 = strongs_0[0xf]->prev->cur_u;
          FVar6 = FT_MulFix_x86_64((int)pPStack_d8->org_u - (int)strongs_0[0xf]->prev->org_u,FVar6);
          pPStack_d8->cur_u = lVar2 + FVar6;
        }
        else {
          pPVar3 = (&strongs_0[0xf]->prev)[u._4_4_ - 1];
          u._4_4_ = points._4_4_;
          while ((u._4_4_ != 0 && (pPStack_d8->org_u <= (&strongs_0[0xf]->prev)[u._4_4_ - 1]->org_u)
                 )) {
            u._4_4_ = u._4_4_ - 1;
          }
          if (u._4_4_ == points._4_4_) {
            lVar2 = (&strongs_0[0xf]->prev)[u._4_4_ - 1]->cur_u;
            FVar6 = FT_MulFix_x86_64((int)pPStack_d8->org_u -
                                     (int)(&strongs_0[0xf]->prev)[u._4_4_ - 1]->org_u,FVar6);
            pPStack_d8->cur_u = lVar2 + FVar6;
          }
          else {
            pPVar4 = (&strongs_0[0xf]->prev)[u._4_4_];
            lVar2 = pPStack_d8->org_u;
            if (lVar2 == pPVar3->org_u) {
              pPStack_d8->cur_u = pPVar3->cur_u;
            }
            else if (lVar2 == pPVar4->org_u) {
              pPStack_d8->cur_u = pPVar4->cur_u;
            }
            else {
              lVar5 = pPVar3->cur_u;
              FVar7 = FT_MulDiv(lVar2 - pPVar3->org_u,pPVar4->cur_u - pPVar3->cur_u,
                                pPVar4->org_u - pPVar3->org_u);
              pPStack_d8->cur_u = lVar5 + FVar7;
            }
          }
        }
        pPStack_d8->flags2 = pPStack_d8->flags2 | 0x20;
      }
LAB_00313459:
    }
    if (strongs_0[0xf] != (PSH_Point_conflict)auStack_b8) {
      ft_mem_free(memory_00,strongs_0[0xf]);
    }
  }
  return;
}

Assistant:

static void
  psh_glyph_interpolate_normal_points( PSH_Glyph  glyph,
                                       FT_Int     dimension )
  {

#if 1
    /* first technique: a point is strong if it is a local extremum */

    PSH_Dimension  dim    = &glyph->globals->dimension[dimension];
    FT_Fixed       scale  = dim->scale_mult;
    FT_Memory      memory = glyph->memory;

    PSH_Point*     strongs     = NULL;
    PSH_Point      strongs_0[PSH_MAX_STRONG_INTERNAL];
    FT_UInt        num_strongs = 0;

    PSH_Point      points = glyph->points;
    PSH_Point      points_end = points + glyph->num_points;
    PSH_Point      point;


    /* first count the number of strong points */
    for ( point = points; point < points_end; point++ )
    {
      if ( psh_point_is_strong( point ) )
        num_strongs++;
    }

    if ( num_strongs == 0 )  /* nothing to do here */
      return;

    /* allocate an array to store a list of points, */
    /* stored in increasing org_u order             */
    if ( num_strongs <= PSH_MAX_STRONG_INTERNAL )
      strongs = strongs_0;
    else
    {
      FT_Error  error;


      if ( FT_NEW_ARRAY( strongs, num_strongs ) )
        return;
    }

    num_strongs = 0;
    for ( point = points; point < points_end; point++ )
    {
      PSH_Point*  insert;


      if ( !psh_point_is_strong( point ) )
        continue;

      for ( insert = strongs + num_strongs; insert > strongs; insert-- )
      {
        if ( insert[-1]->org_u <= point->org_u )
          break;

        insert[0] = insert[-1];
      }
      insert[0] = point;
      num_strongs++;
    }

    /* now try to interpolate all normal points */
    for ( point = points; point < points_end; point++ )
    {
      if ( psh_point_is_strong( point ) )
        continue;

      /* sometimes, some local extrema are smooth points */
      if ( psh_point_is_smooth( point ) )
      {
        if ( point->dir_in == PSH_DIR_NONE   ||
             point->dir_in != point->dir_out )
          continue;

        if ( !psh_point_is_extremum( point ) &&
             !psh_point_is_inflex( point )   )
          continue;

        point->flags &= ~PSH_POINT_SMOOTH;
      }

      /* find best enclosing point coordinates then interpolate */
      {
        PSH_Point   before, after;
        FT_UInt     nn;


        for ( nn = 0; nn < num_strongs; nn++ )
          if ( strongs[nn]->org_u > point->org_u )
            break;

        if ( nn == 0 )  /* point before the first strong point */
        {
          after = strongs[0];

          point->cur_u = after->cur_u +
                           FT_MulFix( point->org_u - after->org_u,
                                      scale );
        }
        else
        {
          before = strongs[nn - 1];

          for ( nn = num_strongs; nn > 0; nn-- )
            if ( strongs[nn - 1]->org_u < point->org_u )
              break;

          if ( nn == num_strongs )  /* point is after last strong point */
          {
            before = strongs[nn - 1];

            point->cur_u = before->cur_u +
                             FT_MulFix( point->org_u - before->org_u,
                                        scale );
          }
          else
          {
            FT_Pos  u;


            after = strongs[nn];

            /* now interpolate point between before and after */
            u = point->org_u;

            if ( u == before->org_u )
              point->cur_u = before->cur_u;

            else if ( u == after->org_u )
              point->cur_u = after->cur_u;

            else
              point->cur_u = before->cur_u +
                               FT_MulDiv( u - before->org_u,
                                          after->cur_u - before->cur_u,
                                          after->org_u - before->org_u );
          }
        }
        psh_point_set_fitted( point );
      }
    }

    if ( strongs != strongs_0 )
      FT_FREE( strongs );

#endif /* 1 */

  }